

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O0

void __thiscall IOContextDemuxer::skip_bytes(IOContextDemuxer *this,uint64_t size)

{
  int iVar1;
  undefined4 extraout_var;
  ulong local_58;
  uint64_t local_50;
  uint64_t copyLen_1;
  uint8_t *data;
  uint64_t copyLen;
  uint64_t skipLeft;
  int readRez;
  uint32_t readedBytes;
  uint64_t size_local;
  IOContextDemuxer *this_local;
  
  if (size != 0) {
    skipLeft._4_4_ = 0;
    skipLeft._0_4_ = 0;
    copyLen = size;
    _readRez = size;
    size_local = (uint64_t)this;
    if (this->m_curPos < this->m_bufEnd) {
      local_50 = size;
      if ((ulong)((long)this->m_bufEnd - (long)this->m_curPos) < size) {
        local_50 = (long)this->m_bufEnd - (long)this->m_curPos;
      }
      copyLen = size - local_50;
      this->m_curPos = this->m_curPos + local_50;
      this->m_processedBytes = local_50 + this->m_processedBytes;
    }
    for (; copyLen != 0; copyLen = copyLen - local_58) {
      iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                        (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(long)&skipLeft + 4,
                         &skipLeft,0);
      if ((skipLeft._4_4_ != 0) && ((int)skipLeft == 0)) {
        (*this->m_bufferedReader->_vptr_AbstractReader[5])
                  (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(ulong)skipLeft._4_4_);
      }
      this->m_curPos = (uint8_t *)(CONCAT44(extraout_var,iVar1) + 0xbc);
      this->m_bufEnd = this->m_curPos + skipLeft._4_4_;
      if (skipLeft._4_4_ == 0) {
        return;
      }
      if (skipLeft._4_4_ < copyLen) {
        local_58 = (ulong)skipLeft._4_4_;
      }
      else {
        local_58 = copyLen;
      }
      this->m_curPos = this->m_curPos + local_58;
      this->m_processedBytes = local_58 + this->m_processedBytes;
    }
  }
  return;
}

Assistant:

void IOContextDemuxer::skip_bytes(const uint64_t size)
{
    if (size == 0)
        return;
    uint32_t readedBytes = 0;
    int readRez = 0;
    uint64_t skipLeft = size;

    if (m_curPos < m_bufEnd)
    {
        const uint64_t copyLen = min((uint64_t)(m_bufEnd - m_curPos), skipLeft);
        skipLeft -= copyLen;
        m_curPos += copyLen;
        m_processedBytes += copyLen;
    }
    /*
    while (skipLeft > 4LL * m_fileBlockSize)
    {
        m_bufferedReader->seek(m_readerID, m_fileBlockSize);
        m_processedBytes += m_fileBlockSize;
        skipLeft -= m_fileBlockSize;
    }
    */
    while (skipLeft > 0)
    {
        uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);
        if (readedBytes > 0 && readRez == 0)
            m_bufferedReader->notify(m_readerID, readedBytes);
        m_curPos = data + 188;
        m_bufEnd = m_curPos + readedBytes;
        if (readedBytes == 0)
            break;
        const uint64_t copyLen = min((uint64_t)readedBytes, skipLeft);
        m_curPos += copyLen;
        m_processedBytes += copyLen;
        skipLeft -= copyLen;
    }
}